

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Catch::LegacyReporterAdapter::assertionEnded
          (LegacyReporterAdapter *this,AssertionStats *assertionStats)

{
  pointer pMVar1;
  IReporter *pIVar2;
  char *__end;
  pointer _macroName;
  AssertionInfo info;
  AssertionResult result;
  ExpressionResultBuilder expressionBuilder;
  AssertionInfo local_380;
  AssertionResult local_310;
  undefined1 local_258 [552];
  
  if ((assertionStats->assertionResult).m_resultData.resultType != Ok) {
    _macroName = (assertionStats->infoMessages).
                 super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl
                 .super__Vector_impl_data._M_start;
    pMVar1 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (_macroName != pMVar1) {
      do {
        if (_macroName->type == Info) {
          ExpressionResultBuilder::ExpressionResultBuilder
                    ((ExpressionResultBuilder *)local_258,_macroName->type);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_258 + 0xb0),(_macroName->message)._M_dataplus._M_p,
                     (_macroName->message)._M_string_length);
          local_310.m_info.macroName._M_dataplus._M_p = (pointer)&local_310.m_info.macroName.field_2
          ;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"","");
          AssertionInfo::AssertionInfo
                    (&local_380,&_macroName->macroName,&_macroName->lineInfo,(string *)&local_310,
                     Normal);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310.m_info.macroName._M_dataplus._M_p != &local_310.m_info.macroName.field_2)
          {
            operator_delete(local_310.m_info.macroName._M_dataplus._M_p);
          }
          ExpressionResultBuilder::buildResult
                    (&local_310,(ExpressionResultBuilder *)local_258,&local_380);
          pIVar2 = (this->m_legacyReporter).m_p;
          (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar2,&local_310);
          AssertionResult::~AssertionResult(&local_310);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380.capturedExpression._M_dataplus._M_p !=
              &local_380.capturedExpression.field_2) {
            operator_delete(local_380.capturedExpression._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380.lineInfo.file._M_dataplus._M_p != &local_380.lineInfo.file.field_2) {
            operator_delete(local_380.lineInfo.file._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380.macroName._M_dataplus._M_p != &local_380.macroName.field_2) {
            operator_delete(local_380.macroName._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_258 + 0xb0));
          std::ios_base::~ios_base((ios_base *)(local_258 + 0x120));
          if ((undefined1 *)local_258._144_8_ != local_258 + 0xa0) {
            operator_delete((void *)local_258._144_8_);
          }
          if ((undefined1 *)local_258._112_8_ != local_258 + 0x80) {
            operator_delete((void *)local_258._112_8_);
          }
          if ((undefined1 *)local_258._80_8_ != local_258 + 0x60) {
            operator_delete((void *)local_258._80_8_);
          }
          if ((undefined1 *)local_258._32_8_ != local_258 + 0x30) {
            operator_delete((void *)local_258._32_8_);
          }
          if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
            operator_delete((void *)local_258._0_8_);
          }
        }
        _macroName = _macroName + 1;
      } while (_macroName != pMVar1);
    }
  }
  pIVar2 = (this->m_legacyReporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
            (pIVar2,&assertionStats->assertionResult);
  return true;
}

Assistant:

bool LegacyReporterAdapter::assertionEnded( AssertionStats const& assertionStats ) {
        if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
            for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                    it != itEnd;
                    ++it ) {
                if( it->type == ResultWas::Info ) {
                    ExpressionResultBuilder expressionBuilder( it->type );
                        expressionBuilder << it->message;
                    AssertionInfo info( it->macroName, it->lineInfo, "", ResultDisposition::Normal );
                    AssertionResult result = expressionBuilder.buildResult( info );
                    m_legacyReporter->Result( result );
                }
            }
        }
        m_legacyReporter->Result( assertionStats.assertionResult );
        return true;
    }